

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O0

int anon_unknown.dwarf_fc12::RtMidiIn_setcallback(lua_State *L)

{
  _Base_ptr this;
  int iVar1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  pointer userData;
  _Base_ptr local_50;
  pair<RtMidiIn_*,_lua_State_*> local_48;
  _Rb_tree_iterator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_> local_38;
  iterator it;
  pair<RtMidiIn_*,_lua_State_*> local_28;
  _Base_ptr local_18;
  RtMidiIn *self;
  lua_State *L_local;
  
  self = (RtMidiIn *)L;
  local_18 = (_Base_ptr)getRtMidiIn(L,1);
  iVar1 = lua_type(self,2);
  if (iVar1 < 1) {
    RtMidiIn::cancelCallback((RtMidiIn *)local_18);
  }
  else {
    lua_pushvalue(self,2);
    lua_pushvalue(self,3);
    lua_pushcclosure(self,RtMidiIn_callbackwrapper,2);
    mVar2 = luaL_ref(self,0xffffd8f0);
    it._M_node = local_18;
    std::pair<RtMidiIn_*,_lua_State_*>::pair<RtMidiIn_*,_lua_State_*&,_true>
              (&local_28,(RtMidiIn **)&it,(lua_State **)&self);
    pmVar3 = std::
             map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
             ::operator[]((map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
                           *)(anonymous_namespace)::RtMidiIn_callbacks,&local_28);
    *pmVar3 = mVar2;
    local_50 = local_18;
    std::pair<RtMidiIn_*,_lua_State_*>::pair<RtMidiIn_*,_lua_State_*&,_true>
              (&local_48,(RtMidiIn **)&local_50,(lua_State **)&self);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
         ::find((map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
                 *)(anonymous_namespace)::RtMidiIn_callbacks,&local_48);
    this = local_18;
    userData = std::_Rb_tree_iterator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>::
               operator->(&local_38);
    RtMidiIn::setCallback((RtMidiIn *)this,RtMidiInCustomCallback,userData);
  }
  return 0;
}

Assistant:

int RtMidiIn_setcallback(lua_State *L) {
	auto &self = getRtMidiIn(L, 1);
	if (lua_isnoneornil(L, 2))
		self.cancelCallback();
	else {
		lua_pushvalue(L, 2);
		lua_pushvalue(L, 3);
		lua_pushcclosure(L, RtMidiIn_callbackwrapper, 2);
		RtMidiIn_callbacks[{&self, L}] = luaL_ref(L, LUA_REGISTRYINDEX);
		auto it = RtMidiIn_callbacks.find({&self, L});
		self.setCallback(RtMidiInCustomCallback,
		 static_cast<void *>(const_cast<RtMidiIn_callback_rec *>(&it->first)));
	}
	return 0;
}